

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O1

string * __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,ReporterFactory *this)

{
  char *pcVar1;
  size_type local_20;
  size_type __dnew;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_20 = 0x27;
  pcVar1 = (char *)std::__cxx11::string::_M_create((ulong *)__return_storage_ptr__,(ulong)&local_20)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = local_20;
  builtin_strncpy(pcVar1,"Reports test results as an XML document",0x27);
  __return_storage_ptr__->_M_string_length = local_20;
  pcVar1[local_20] = '\0';
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getDescription() const {
                return T::getDescription();
            }